

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_get_bit_size(coda_type *type,int64_t *bit_size)

{
  int64_t local_28;
  int64_t *bit_size_local;
  coda_type *type_local;
  
  if (type == (coda_type *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xb95);
    type_local._4_4_ = -1;
  }
  else if (bit_size == (int64_t *)0x0) {
    coda_set_error(-100,"bit_size argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xb9a);
    type_local._4_4_ = -1;
  }
  else {
    if (type->bit_size < 0) {
      local_28 = -1;
    }
    else {
      local_28 = type->bit_size;
    }
    *bit_size = local_28;
    type_local._4_4_ = 0;
  }
  return type_local._4_4_;
}

Assistant:

LIBCODA_API int coda_type_get_bit_size(const coda_type *type, int64_t *bit_size)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (bit_size == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "bit_size argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *bit_size = (type->bit_size >= 0 ? type->bit_size : -1);
    return 0;
}